

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O0

bool bssl::tls13_post_handshake(SSL *ssl,SSLMessage *msg)

{
  int iVar1;
  SSLMessage *msg_local;
  SSL *ssl_local;
  
  if ((msg->type == '\x04') && ((ssl->field_0xa4 & 1) == 0)) {
    ssl_local._7_1_ = tls13_process_new_session_ticket(ssl,msg);
  }
  else if (msg->type == '\x18') {
    ssl->s3->key_update_count = ssl->s3->key_update_count + '\x01';
    iVar1 = SSL_is_quic(ssl);
    if ((iVar1 == 0) && (ssl->s3->key_update_count < 0x21)) {
      ssl_local._7_1_ = tls13_receive_key_update(ssl,msg);
    }
    else {
      ERR_put_error(0x10,0,0x104,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                    ,0x2cb);
      ssl_send_alert(ssl,2,10);
      ssl_local._7_1_ = false;
    }
  }
  else {
    ssl->s3->key_update_count = '\0';
    ssl_send_alert(ssl,2,10);
    ERR_put_error(0x10,0,0xdf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x2d6);
    ssl_local._7_1_ = false;
  }
  return ssl_local._7_1_;
}

Assistant:

bool tls13_post_handshake(SSL *ssl, const SSLMessage &msg) {
  if (msg.type == SSL3_MT_NEW_SESSION_TICKET && !ssl->server) {
    return tls13_process_new_session_ticket(ssl, msg);
  }

  if (msg.type == SSL3_MT_KEY_UPDATE) {
    ssl->s3->key_update_count++;
    if (SSL_is_quic(ssl) || ssl->s3->key_update_count > kMaxKeyUpdates) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_KEY_UPDATES);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
      return false;
    }

    return tls13_receive_key_update(ssl, msg);
  }

  ssl->s3->key_update_count = 0;

  ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
  OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_MESSAGE);
  return false;
}